

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_reduce(bsc_step_t depends,bsc_pid_t root,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size)

{
  bsc_coll_params_t params;
  bsc_step_t bVar1;
  void *pvStack_60;
  bsc_coll_params_t p;
  void *tmp_space_local;
  void *dst_local;
  void *src_local;
  bsc_group_t group_local;
  bsc_pid_t root_local;
  bsc_step_t depends_local;
  
  p._40_8_ = tmp_space;
  memset(&pvStack_60,0,0x30);
  p.dst = (void *)p._40_8_;
  p.tmp = reducer;
  p.reducer = (bsc_reduce_t)zero;
  p.zero._0_4_ = nmemb;
  p.zero._4_4_ = size;
  params.size = size;
  params.nmemb = nmemb;
  params.dst = dst;
  params.src = src;
  params.tmp = (void *)p._40_8_;
  params.reducer = reducer;
  params.zero = zero;
  pvStack_60 = src;
  p.src = dst;
  bVar1 = bsc_collective(depends,&bsc_reduce_algs,root,group,params);
  return bVar1;
}

Assistant:

bsc_step_t bsc_reduce( bsc_step_t depends, 
        bsc_pid_t root, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size )
{
    bsc_coll_params_t p; memset(&p, 0, sizeof(p));
    p.src = src;
    p.dst = dst;
    p.tmp = tmp_space;
    p.reducer = reducer;
    p.zero = zero;
    p.nmemb = nmemb;
    p.size = size;
    return bsc_collective( depends, bsc_coll_reduce, root, group, p );
}